

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O1

bool check_dodge(CHAR_DATA *ch,CHAR_DATA *victim,int dt)

{
  short sVar1;
  bool bVar2;
  short sVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  uint uVar10;
  char *pcVar11;
  float fVar12;
  float fVar13;
  char buf2 [4608];
  char buf1 [4608];
  float local_2440;
  char local_2438 [4608];
  char local_1238 [4616];
  
  bVar2 = is_awake(victim);
  if (!bVar2) {
    return false;
  }
  iVar4 = get_skill(victim,(int)gsn_dodge);
  fVar12 = (float)((iVar4 * 3) / 10);
  uVar5 = get_curr_stat(victim,3);
  iVar4 = get_curr_stat(ch,3);
  if ((int)uVar5 < 6) goto LAB_00295849;
  if ((int)uVar5 < 0xb) {
    fVar13 = (float)(uVar5 >> 1);
  }
  else {
    if ((int)uVar5 < 0x10) {
      uVar10 = (uint)((ulong)(uVar5 * 2) * 0x55555556 >> 0x20);
    }
    else {
      if (0x14 < (int)uVar5) {
        fVar13 = (float)(int)uVar5;
        goto LAB_0029583c;
      }
      uVar10 = (uint)((ulong)(uVar5 * 8) * 0x66666667 >> 0x22);
    }
    fVar13 = (float)uVar10;
  }
LAB_0029583c:
  fVar12 = fVar12 + fVar13;
LAB_00295849:
  iVar6 = check_terrain_mastery(ch);
  iVar7 = check_terrain_mastery(victim);
  local_2440 = (float)iVar7 + (((float)(int)((uVar5 - iVar4) * 2) + fVar12) - (float)iVar6);
  bVar2 = is_affected_room(ch->in_room,(int)gsn_blanket);
  if (bVar2) {
    local_2440 = local_2440 * 0.8;
  }
  bVar2 = is_npc(ch);
  if (((!bVar2) && (iVar4 = check_posture(ch), iVar4 == -1)) &&
     (bVar2 = style_check((int)gsn_posture,(int)ch->pcdata->style), bVar2)) {
    local_2440 = local_2440 + 20.0;
  }
  bVar2 = is_evil(victim);
  if (((bVar2) && (victim->level < ch->level)) && (bVar2 = is_affected(ch,(int)gsn_awe), bVar2)) {
    local_2440 = local_2440 + -20.0;
  }
  bVar2 = is_npc(victim);
  if (!bVar2) {
    iVar4 = check_posture(victim);
    if ((iVar4 == -1) && (bVar2 = style_check((int)gsn_posture,(int)victim->pcdata->style), bVar2))
    {
      local_2440 = local_2440 + 20.0;
    }
    iVar4 = check_posture(victim);
    if ((iVar4 == 1) && (bVar2 = style_check((int)gsn_posture,(int)victim->pcdata->style), bVar2)) {
      local_2440 = local_2440 + -20.0;
    }
  }
  bVar2 = is_npc(victim);
  if ((!bVar2) && ((victim->act[0] & 0x200000) != 0)) {
    local_2440 = local_2440 * 0.5;
  }
  bVar2 = check_entwine(victim,2);
  if (bVar2) {
    local_2440 = local_2440 * 0.5;
  }
  bVar2 = is_affected(victim,(int)gsn_creeping_tomb);
  if (bVar2) {
    local_2440 = local_2440 * 0.75;
  }
  sVar1 = ch->defense_mod;
  sVar3 = get_hitroll(ch);
  local_2440 = ((float)(int)sVar3 / -250.0 + 1.0) * ((float)(int)sVar1 + local_2440);
  bVar2 = is_npc(victim);
  if (!bVar2) {
    iVar4 = armor_weight(victim);
    bVar2 = check_ease(victim);
    if (bVar2) {
      iVar6 = get_skill(victim,(int)gsn_ease);
      iVar4 = iVar4 - (int)((float)iVar6 * (float)iVar4 * 0.005);
    }
    iVar6 = get_curr_stat(victim,0);
    local_2440 = local_2440 * ((float)((iVar6 * 5 - iVar4) + 0xd2) / 250.0);
    if (local_2440 < 0.0) {
      local_2440 = 0.0;
    }
  }
  bVar2 = is_npc(victim);
  if ((bVar2) || (bVar2 = is_npc(ch), bVar2)) {
    local_2440 = local_2440 + (float)((int)victim->level - (int)ch->level);
  }
  fVar12 = ((float)(int)ch->balance + (local_2440 - (float)(int)victim->balance)) -
           (float)ch->analyze;
  if (victim->analyzePC == ch) {
    fVar12 = fVar12 + (float)victim->analyze;
  }
  bVar2 = is_npc(victim);
  if ((!bVar2) && (bVar2 = style_check((int)gsn_evasion,(int)victim->pcdata->style), bVar2)) {
    iVar4 = check_evasion(victim,(int)fVar12);
    fVar12 = fVar12 + (float)iVar4;
  }
  fVar13 = 95.0;
  if (fVar12 <= 95.0) {
    fVar13 = fVar12;
  }
  uVar5 = number_percent();
  if (fVar13 <= (float)(int)uVar5) {
    return false;
  }
  uVar10 = (uint)fVar13;
  pcVar8 = get_attack_noun(ch,dt);
  pcVar9 = "barely ";
  if (0xe < (int)(uVar10 - uVar5)) {
    pcVar9 = "";
  }
  pcVar11 = " with ease";
  if ((int)(uVar10 - uVar5) < 0x33) {
    pcVar11 = "";
  }
  sprintf(local_1238,"You %sdodge $n\'s %s%s.",pcVar9,pcVar8,pcVar11);
  sprintf(local_2438,"$N %sdodges your %s%s.",pcVar9,pcVar8,pcVar11);
  if ((victim->wiznet[0] & 0x200000) != 0) {
    sprintf(local_1238,"You dodge $n\'s %s. (%d%% -- %d%% needed)",pcVar8,(ulong)uVar5,(ulong)uVar10
           );
  }
  if ((ch->wiznet[0] & 0x200000) != 0) {
    sprintf(local_2438,"$N dodges your %s. (%d%% -- %d%% needed)",pcVar8,(ulong)uVar5,(ulong)uVar10)
    ;
  }
  act(local_1238,ch,(void *)0x0,victim,2);
  act(local_2438,ch,(void *)0x0,victim,3);
  check_improve(victim,(int)gsn_dodge,true,5);
  return true;
}

Assistant:

bool check_dodge(CHAR_DATA *ch, CHAR_DATA *victim, int dt)
{
	float chance;
	char buf1[MAX_STRING_LENGTH], buf2[MAX_STRING_LENGTH];
	char *attack;
	int dex, dexa, str;
	int encumb;
	int roll, diff;

	if (!is_awake(victim))
		return false;

	chance = (3 * get_skill(victim, gsn_dodge) / 10);

	dex = get_curr_stat(victim, STAT_DEX);
	dexa = get_curr_stat(ch, STAT_DEX);

	if (dex <= 5)
		chance += 0;
	else if (dex <= 10)
		chance += dex / 2;
	else if (dex <= 15)
		chance += (2 * dex / 3);
	else if (dex <= 20)
		chance += (8 * dex / 10);
	else
		chance += dex;

	chance += (dex - dexa) * 2;
	chance -= check_terrain_mastery(ch);
	chance += check_terrain_mastery(victim);

	if (is_affected_room(ch->in_room, gsn_blanket))
		chance *= 0.8;

	/* posture */
	if (!is_npc(ch))
	{
		if (check_posture(ch) == POSTURE_DEFENSE && style_check(gsn_posture, ch->pcdata->style))
			chance += 20;
	}

	if (is_evil(victim) && (ch->level > victim->level) && is_affected(ch, gsn_awe))
		chance -= 20;

	if (!is_npc(victim))
	{
		if (check_posture(victim) == POSTURE_DEFENSE && style_check(gsn_posture, victim->pcdata->style))
			chance += 20;

		if (check_posture(victim) == POSTURE_OFFENSE && style_check(gsn_posture, victim->pcdata->style))
			chance -= 20;
	}

	if (!is_npc(victim) && IS_SET(victim->act, PLR_MORON))
		chance /= 2;

	if (check_entwine(victim, 2))
		chance /= 2;

	if (is_affected(victim, gsn_creeping_tomb))
		chance *= 0.75;

	chance += ch->defense_mod;
	chance *= (1 - ((float)get_hitroll(ch) / (float)250));

	if (!is_npc(victim))
	{
		encumb = armor_weight(victim);

		if (check_ease(victim))
			encumb -= (int)((float)encumb * (float)0.005 * (float)get_skill(victim, gsn_ease));

		str = get_curr_stat(victim, STAT_STR);
		chance *= (float)(300 + (5 * (str - 18)) - encumb) / (float)250;

		if (chance < 0)
			chance = 0;
	}

	if (is_npc(victim) || is_npc(ch))
		chance += (victim->level - ch->level);

	// chance -= 5*abs((ch->size-victim->size));

	chance -= victim->balance;
	chance += ch->balance;
	chance -= ch->analyze;

	if (victim->analyzePC == ch)
		chance += victim->analyze;

	if (!is_npc(victim) && style_check(gsn_evasion, victim->pcdata->style))
		chance += check_evasion(victim, (int)chance);

	chance = std::min(chance, (float)95);

	roll = number_percent();

	if (roll >= chance)
		return false;

	diff = (int)chance - roll;

	attack = get_dam_message(ch, dt);

	sprintf(buf1, "You %sdodge $n's %s%s.", (diff < 15) ? "barely " : "", attack, (diff > 50) ? " with ease" : "");
	sprintf(buf2, "$N %sdodges your %s%s.", (diff < 15) ? "barely " : "", attack, (diff > 50) ? " with ease" : "");

	if (IS_SET(victim->wiznet, WIZ_PERCENT))
		sprintf(buf1, "You dodge $n's %s. (%d%% -- %d%% needed)", attack, roll, (int)chance);

	if (IS_SET(ch->wiznet, WIZ_PERCENT))
		sprintf(buf2, "$N dodges your %s. (%d%% -- %d%% needed)", attack, roll, (int)chance);

	act(buf1, ch, 0, victim, TO_VICT);
	act(buf2, ch, 0, victim, TO_CHAR);

	check_improve(victim, gsn_dodge, true, 5);

	return true;
}